

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.h
# Opt level: O0

void __thiscall vpl::Scope::CheckArgCnt(Scope *this,size_t arg_cnt)

{
  runtime_error *prVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  size_type sVar3;
  ostream *poVar4;
  string local_1d0 [32];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [392];
  size_t local_18;
  size_t arg_cnt_local;
  Scope *this_local;
  
  local_18 = arg_cnt;
  arg_cnt_local = (size_t)this;
  if (this->cur_func_ptr_ == (Function *)0x0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"Function is not prepared!");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar2 = Function::GetArgs_abi_cxx11_(this->cur_func_ptr_);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(pvVar2);
  if (arg_cnt != sVar3) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar4 = std::operator<<(local_1a0,"Wrong number of arguments: expected ");
    pvVar2 = Function::GetArgs_abi_cxx11_(this->cur_func_ptr_);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvVar2);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
    poVar4 = std::operator<<(poVar4,", got ");
    std::ostream::operator<<(poVar4,local_18);
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(prVar1,local_1d0);
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void CheckArgCnt(size_t arg_cnt) {
        if (cur_func_ptr_ == nullptr) {
            throw std::runtime_error("Function is not prepared!");
        }
        if (arg_cnt != cur_func_ptr_->GetArgs().size()) {
            std::stringstream ss;
            ss << "Wrong number of arguments: expected " << cur_func_ptr_->GetArgs().size() << ", got " << arg_cnt;
            throw std::runtime_error(ss.str());
        }
    }